

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_vector.h
# Opt level: O0

void __thiscall
crnlib::vector<crnlib::vec<16U,_float>_>::clear(vector<crnlib::vec<16U,_float>_> *this)

{
  vector<crnlib::vec<16U,_float>_> *this_local;
  
  if (this->m_p != (vec<16U,_float> *)0x0) {
    scalar_type<crnlib::vec<16U,_float>_>::destruct_array(this->m_p,this->m_size);
    crnlib_free(this->m_p);
    this->m_p = (vec<16U,_float> *)0x0;
    this->m_size = 0;
    this->m_capacity = 0;
  }
  return;
}

Assistant:

inline void clear()
        {
            if (m_p)
            {
                scalar_type<T>::destruct_array(m_p, m_size);
                crnlib_free(m_p);
                m_p = nullptr;
                m_size = 0;
                m_capacity = 0;
            }
        }